

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  xmlNodePtr pxVar1;
  int iVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (set2->nodeNr <= lVar3) {
      set2->nodeNr = 0;
      return set1;
    }
    pxVar1 = set2->nodeTab[lVar3];
    iVar2 = set1->nodeNr;
    if (set1->nodeMax <= iVar2) {
      iVar2 = xmlXPathNodeSetGrow(set1);
      if (iVar2 < 0) {
        xmlXPathFreeNodeSet(set1);
        xmlXPathNodeSetClear(set2,1);
        return (xmlNodeSetPtr)0x0;
      }
      iVar2 = set1->nodeNr;
    }
    set1->nodeNr = iVar2 + 1;
    set1->nodeTab[iVar2] = pxVar1;
    set2->nodeTab[lVar3] = (xmlNodePtr)0x0;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i;
	xmlNodePtr n2;

	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
            if (set1->nodeNr >= set1->nodeMax) {
                if (xmlXPathNodeSetGrow(set1) < 0)
                    goto error;
            }
	    set1->nodeTab[set1->nodeNr++] = n2;
            set2->nodeTab[i] = NULL;
	}
    }
    set2->nodeNr = 0;
    return(set1);

error:
    xmlXPathFreeNodeSet(set1);
    xmlXPathNodeSetClear(set2, 1);
    return(NULL);
}